

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O3

void lzma_decoder_reset(lzma_coder_conflict8 *coder,void *opt)

{
  probability *ppVar1;
  probability (*papVar2) [8];
  uint32_t uVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  probability (*papVar6) [16];
  probability (*papVar7) [64];
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  lzma_coder_conflict8 *plVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar26;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  bVar5 = (byte)*(undefined4 *)((long)opt + 0x1c);
  uVar11 = -1 << (bVar5 & 0x1f);
  uVar12 = ~uVar11;
  coder->pos_mask = uVar12;
  uVar3 = *(uint32_t *)((long)opt + 0x14);
  iVar20 = *(int *)((long)opt + 0x18);
  uVar14 = iVar20 + uVar3;
  if (uVar14 < 5) {
    uVar9 = 0;
    plVar15 = coder;
    do {
      lVar8 = 0;
      do {
        ppVar1 = plVar15->literal[0] + lVar8;
        ppVar1[0] = 0x400;
        ppVar1[1] = 0x400;
        ppVar1[2] = 0x400;
        ppVar1[3] = 0x400;
        ppVar1[4] = 0x400;
        ppVar1[5] = 0x400;
        ppVar1[6] = 0x400;
        ppVar1[7] = 0x400;
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x300);
      uVar9 = uVar9 + 1;
      plVar15 = (lzma_coder_conflict8 *)(plVar15->literal + 1);
    } while (uVar9 >> ((byte)uVar14 & 0x1f) == 0);
    coder->literal_context_bits = uVar3;
    coder->literal_pos_mask = ~(-1 << ((byte)iVar20 & 0x1f));
    coder->state = STATE_LIT_LIT;
    coder->rep0 = 0;
    coder->rep1 = 0;
    coder->rep2 = 0;
    coder->rep3 = 0;
    coder->pos_mask = uVar12;
    (coder->rc).range = 0xffffffff;
    (coder->rc).code = 0;
    (coder->rc).init_bytes_left = 5;
    papVar6 = coder->is_rep0_long;
    lVar8 = 0;
    do {
      uVar13 = 0;
      do {
        papVar6[-0xf][uVar13] = 0x400;
        (*papVar6)[uVar13] = 0x400;
        uVar13 = uVar13 + 1;
      } while (-uVar11 != uVar13);
      coder->is_rep[lVar8] = 0x400;
      coder->is_rep0[lVar8] = 0x400;
      coder->is_rep1[lVar8] = 0x400;
      coder->is_rep2[lVar8] = 0x400;
      lVar8 = lVar8 + 1;
      papVar6 = papVar6 + 1;
    } while (lVar8 != 0xc);
    papVar7 = coder->pos_slot;
    lVar8 = 0;
    do {
      lVar10 = 0;
      do {
        ppVar1 = *papVar7 + lVar10;
        ppVar1[0] = 0x400;
        ppVar1[1] = 0x400;
        ppVar1[2] = 0x400;
        ppVar1[3] = 0x400;
        ppVar1[4] = 0x400;
        auVar4 = _DAT_004b1b50;
        ppVar1[5] = 0x400;
        ppVar1[6] = 0x400;
        ppVar1[7] = 0x400;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x40);
      lVar8 = lVar8 + 1;
      papVar7 = papVar7 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    auVar16 = _DAT_004d6f80;
    auVar17 = _DAT_004d6f90;
    auVar18 = _DAT_004d0630;
    auVar19 = _DAT_004b1b40;
    do {
      auVar21 = auVar19 ^ auVar4;
      iVar20 = auVar21._0_4_;
      iVar26 = auVar21._8_4_;
      auVar27._4_4_ = iVar20;
      auVar27._0_4_ = iVar20;
      auVar27._8_4_ = iVar26;
      auVar27._12_4_ = iVar26;
      auVar31._0_4_ = -(uint)(iVar20 < -0x7fffff8e);
      auVar31._4_4_ = -(uint)(iVar20 < -0x7fffff8e);
      auVar31._8_4_ = -(uint)(iVar26 < -0x7fffff8e);
      auVar31._12_4_ = -(uint)(iVar26 < -0x7fffff8e);
      auVar22._0_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar22._4_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar22._8_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar22._12_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar22 = auVar22 & auVar31;
      auVar21 = pshuflw(auVar27,auVar22,0xe8);
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        coder->pos_special[lVar8] = 0x400;
      }
      auVar21 = packssdw(auVar22,auVar22);
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
        coder->pos_special[lVar8 + 1] = 0x400;
      }
      auVar21 = auVar18 ^ auVar4;
      iVar20 = auVar21._0_4_;
      iVar26 = auVar21._8_4_;
      auVar28._4_4_ = iVar20;
      auVar28._0_4_ = iVar20;
      auVar28._8_4_ = iVar26;
      auVar28._12_4_ = iVar26;
      auVar32._0_4_ = -(uint)(iVar20 < -0x7fffff8e);
      auVar32._4_4_ = -(uint)(iVar20 < -0x7fffff8e);
      auVar32._8_4_ = -(uint)(iVar26 < -0x7fffff8e);
      auVar32._12_4_ = -(uint)(iVar26 < -0x7fffff8e);
      auVar23._0_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar23._4_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar23._8_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar23._12_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar23 = auVar23 & auVar32;
      auVar21 = packssdw(auVar28,auVar23);
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        coder->pos_special[lVar8 + 2] = 0x400;
      }
      auVar21 = pshufhw(auVar23,auVar23,0x84);
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        coder->pos_special[lVar8 + 3] = 0x400;
      }
      auVar21 = auVar17 ^ auVar4;
      iVar20 = auVar21._0_4_;
      iVar26 = auVar21._8_4_;
      auVar29._4_4_ = iVar20;
      auVar29._0_4_ = iVar20;
      auVar29._8_4_ = iVar26;
      auVar29._12_4_ = iVar26;
      auVar33._0_4_ = -(uint)(iVar20 < -0x7fffff8e);
      auVar33._4_4_ = -(uint)(iVar20 < -0x7fffff8e);
      auVar33._8_4_ = -(uint)(iVar26 < -0x7fffff8e);
      auVar33._12_4_ = -(uint)(iVar26 < -0x7fffff8e);
      auVar24._0_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar24._4_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar24._8_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar24._12_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar24 = auVar24 & auVar33;
      auVar21 = pshuflw(auVar29,auVar24,0xe8);
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        coder->pos_special[lVar8 + 4] = 0x400;
      }
      auVar21 = packssdw(auVar24,auVar24);
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        coder->pos_special[lVar8 + 5] = 0x400;
      }
      auVar21 = auVar16 ^ auVar4;
      iVar20 = auVar21._0_4_;
      iVar26 = auVar21._8_4_;
      auVar30._4_4_ = iVar20;
      auVar30._0_4_ = iVar20;
      auVar30._8_4_ = iVar26;
      auVar30._12_4_ = iVar26;
      auVar34._0_4_ = -(uint)(iVar20 < -0x7fffff8e);
      auVar34._4_4_ = -(uint)(iVar20 < -0x7fffff8e);
      auVar34._8_4_ = -(uint)(iVar26 < -0x7fffff8e);
      auVar34._12_4_ = -(uint)(iVar26 < -0x7fffff8e);
      auVar25._0_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar25._4_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar25._8_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar25._12_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar25 = auVar25 & auVar34;
      auVar21 = packssdw(auVar30,auVar25);
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        coder->pos_special[lVar8 + 6] = 0x400;
      }
      auVar21 = pshufhw(auVar25,auVar25,0x84);
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        coder->pos_special[lVar8 + 7] = 0x400;
      }
      lVar8 = lVar8 + 8;
      lVar10 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 8;
      auVar19._8_8_ = lVar10 + 8;
      lVar10 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 8;
      auVar18._8_8_ = lVar10 + 8;
      lVar10 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 8;
      auVar17._8_8_ = lVar10 + 8;
      lVar10 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 8;
      auVar16._8_8_ = lVar10 + 8;
    } while (lVar8 != 0x78);
    coder->pos_align[0] = 0x400;
    coder->pos_align[1] = 0x400;
    coder->pos_align[2] = 0x400;
    coder->pos_align[3] = 0x400;
    coder->pos_align[4] = 0x400;
    coder->pos_align[5] = 0x400;
    coder->pos_align[6] = 0x400;
    coder->pos_align[7] = 0x400;
    coder->pos_align[8] = 0x400;
    coder->pos_align[9] = 0x400;
    coder->pos_align[10] = 0x400;
    coder->pos_align[0xb] = 0x400;
    coder->pos_align[0xc] = 0x400;
    coder->pos_align[0xd] = 0x400;
    coder->pos_align[0xe] = 0x400;
    coder->pos_align[0xf] = 0x400;
    (coder->match_len_decoder).choice = 0x400;
    (coder->match_len_decoder).choice2 = 0x400;
    (coder->rep_len_decoder).choice = 0x400;
    (coder->rep_len_decoder).choice2 = 0x400;
    uVar14 = 1;
    do {
      uVar11 = uVar14 - 1;
      papVar2 = (coder->match_len_decoder).low + uVar11;
      *(probability *)((long)papVar2 + 0) = 0x400;
      *(probability *)((long)papVar2 + 2) = 0x400;
      *(probability *)((long)papVar2 + 4) = 0x400;
      *(probability *)((long)papVar2 + 6) = 0x400;
      *(probability *)((long)papVar2 + 8) = 0x400;
      *(probability *)((long)papVar2 + 10) = 0x400;
      *(probability *)((long)papVar2 + 0xc) = 0x400;
      *(probability *)((long)papVar2 + 0xe) = 0x400;
      papVar2 = (coder->match_len_decoder).mid + uVar11;
      *(probability *)((long)papVar2 + 0) = 0x400;
      *(probability *)((long)papVar2 + 2) = 0x400;
      *(probability *)((long)papVar2 + 4) = 0x400;
      *(probability *)((long)papVar2 + 6) = 0x400;
      *(probability *)((long)papVar2 + 8) = 0x400;
      *(probability *)((long)papVar2 + 10) = 0x400;
      *(probability *)((long)papVar2 + 0xc) = 0x400;
      *(probability *)((long)papVar2 + 0xe) = 0x400;
      papVar2 = (coder->rep_len_decoder).low + uVar11;
      *(probability *)((long)papVar2 + 0) = 0x400;
      *(probability *)((long)papVar2 + 2) = 0x400;
      *(probability *)((long)papVar2 + 4) = 0x400;
      *(probability *)((long)papVar2 + 6) = 0x400;
      *(probability *)((long)papVar2 + 8) = 0x400;
      *(probability *)((long)papVar2 + 10) = 0x400;
      *(probability *)((long)papVar2 + 0xc) = 0x400;
      *(probability *)((long)papVar2 + 0xe) = 0x400;
      papVar2 = (coder->rep_len_decoder).mid + uVar11;
      *(probability *)((long)papVar2 + 0) = 0x400;
      *(probability *)((long)papVar2 + 2) = 0x400;
      *(probability *)((long)papVar2 + 4) = 0x400;
      *(probability *)((long)papVar2 + 6) = 0x400;
      *(probability *)((long)papVar2 + 8) = 0x400;
      *(probability *)((long)papVar2 + 10) = 0x400;
      *(probability *)((long)papVar2 + 0xc) = 0x400;
      *(probability *)((long)papVar2 + 0xe) = 0x400;
      uVar11 = uVar14 >> (bVar5 & 0x1f);
      uVar14 = uVar14 + 1;
    } while (uVar11 == 0);
    lVar8 = 0;
    do {
      ppVar1 = (coder->match_len_decoder).high + lVar8;
      ppVar1[0] = 0x400;
      ppVar1[1] = 0x400;
      ppVar1[2] = 0x400;
      ppVar1[3] = 0x400;
      ppVar1[4] = 0x400;
      ppVar1[5] = 0x400;
      ppVar1[6] = 0x400;
      ppVar1[7] = 0x400;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x100);
    lVar8 = 0;
    do {
      ppVar1 = (coder->rep_len_decoder).high + lVar8;
      ppVar1[0] = 0x400;
      ppVar1[1] = 0x400;
      ppVar1[2] = 0x400;
      ppVar1[3] = 0x400;
      ppVar1[4] = 0x400;
      ppVar1[5] = 0x400;
      ppVar1[6] = 0x400;
      ppVar1[7] = 0x400;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x100);
    coder->sequence = SEQ_BLOCK_HEADER;
    coder->probs = (probability *)0x0;
    coder->symbol = 0;
    coder->limit = 0;
    coder->offset = 0;
    coder->len = 0;
    return;
  }
  __assert_fail("lc + lp <= LZMA_LCLP_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_common.h"
                ,0x87,"void literal_init(probability (*)[768], uint32_t, uint32_t)");
}

Assistant:

static void
lzma_decoder_reset(lzma_coder *coder, const void *opt)
{
	uint32_t i, j, pos_state;
	uint32_t num_pos_states;

	const lzma_options_lzma *options = opt;

	// NOTE: We assume that lc/lp/pb are valid since they were
	// successfully decoded with lzma_lzma_decode_properties().

	// Calculate pos_mask. We don't need pos_bits as is for anything.
	coder->pos_mask = (1U << options->pb) - 1;

	// Initialize the literal decoder.
	literal_init(coder->literal, options->lc, options->lp);

	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// State
	coder->state = STATE_LIT_LIT;
	coder->rep0 = 0;
	coder->rep1 = 0;
	coder->rep2 = 0;
	coder->rep3 = 0;
	coder->pos_mask = (1U << options->pb) - 1;

	// Range decoder
	rc_reset(coder->rc);

	// Bit and bittree decoders
	for (i = 0; i < STATES; ++i) {
		for (j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (i = 0; i < LEN_TO_POS_STATES; ++i)
		bittree_reset(coder->pos_slot[i], POS_SLOT_BITS);

	for (i = 0; i < FULL_DISTANCES - END_POS_MODEL_INDEX; ++i)
		bit_reset(coder->pos_special[i]);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Len decoders (also bit/bittree)
	num_pos_states = 1U << options->pb;
	bit_reset(coder->match_len_decoder.choice);
	bit_reset(coder->match_len_decoder.choice2);
	bit_reset(coder->rep_len_decoder.choice);
	bit_reset(coder->rep_len_decoder.choice2);

	for (pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(coder->match_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->match_len_decoder.mid[pos_state],
				LEN_MID_BITS);

		bittree_reset(coder->rep_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->rep_len_decoder.mid[pos_state],
				LEN_MID_BITS);
	}

	bittree_reset(coder->match_len_decoder.high, LEN_HIGH_BITS);
	bittree_reset(coder->rep_len_decoder.high, LEN_HIGH_BITS);

	coder->sequence = SEQ_IS_MATCH;
	coder->probs = NULL;
	coder->symbol = 0;
	coder->limit = 0;
	coder->offset = 0;
	coder->len = 0;

	return;
}